

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToDrawDataSelectLayer(ImGuiWindow *window)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  piVar1 = &(GImGui->IO).MetricsActiveWindows;
  *piVar1 = *piVar1 + 1;
  AddWindowToDrawData((ImVector<ImDrawList_*> *)
                      ((long)&(pIVar2->DrawDataBuilder).Layers[0].Size +
                      (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
  return;
}

Assistant:

static void AddWindowToDrawDataSelectLayer(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsActiveWindows++;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
        AddWindowToDrawData(&g.DrawDataBuilder.Layers[1], window);
    else
        AddWindowToDrawData(&g.DrawDataBuilder.Layers[0], window);
}